

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::ScanScalarEndInFlow(void)

{
  int iVar1;
  RegEx *in_stack_ffffffffffffffc0;
  RegEx *in_stack_ffffffffffffffc8;
  
  if (ScanScalarEndInFlow()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ScanScalarEndInFlow()::e);
    if (iVar1 != 0) {
      EndScalarInFlow();
      BlankOrBreak();
      Comment();
      YAML::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      operator|(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      RegEx::~RegEx((RegEx *)0xf227f5);
      RegEx::~RegEx((RegEx *)0xf227ff);
      __cxa_atexit(RegEx::~RegEx,&ScanScalarEndInFlow::e,&__dso_handle);
      __cxa_guard_release(&ScanScalarEndInFlow()::e);
    }
  }
  return &ScanScalarEndInFlow::e;
}

Assistant:

inline const RegEx& ScanScalarEndInFlow() {
  static const RegEx e = (EndScalarInFlow() | (BlankOrBreak() + Comment()));
  return e;
}